

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

char16_t * __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,char16_t,true>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  char16_t *pcVar1;
  size_t byteSize;
  
  if (count != 0) {
    byteSize = 0xffffffffffffffff;
    if (-1 < (long)count) {
      byteSize = count * 2;
    }
    pcVar1 = (char16_t *)
             new__<Memory::ArenaAllocator>
                       (byteSize,(ArenaAllocator *)this,true,
                        (offset_in_ArenaAllocator_to_subr)allocator);
    return pcVar1;
  }
  return (char16_t *)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}